

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O0

void bit_array_set_range(void *array,size_t bit,size_t count)

{
  size_t i;
  uchar *ptr;
  size_t *size;
  size_t count_local;
  size_t bit_local;
  void *array_local;
  
  if (((array != (void *)0x0) && (count != 0)) && (i = bit, bit < *array)) {
    for (; i < *array && i < bit + count; i = i + 1) {
      *(byte *)((long)array + (i >> 3) + 8) =
           *(byte *)((long)array + (i >> 3) + 8) | (byte)(1 << ((byte)i & 7));
    }
  }
  return;
}

Assistant:

void bit_array_set_range(void * array, size_t bit, size_t count)
{
    if (array && count)
    {
        size_t * size = (size_t *) array;
        if (bit < *size)
        {
            unsigned char * ptr = (unsigned char *)(size + 1);
            size_t i;
            for (i = bit; i < *size && i < bit + count; ++i)
                ptr[i >> 3] |= (1U << (i & 7));
        }
    }
}